

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

int binbuf_getpos(_binbuf *b,int *x0,int *y0,t_symbol **type)

{
  int iVar1;
  t_atom *a;
  t_symbol *ptVar2;
  t_symbol *ptVar3;
  int iVar4;
  t_atom *ptVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  t_atom *ptVar9;
  t_float tVar10;
  int local_50;
  
  a = binbuf_getvec(b);
  iVar1 = binbuf_getnatom(b);
  if (iVar1 < 3) {
    return 0;
  }
  ptVar2 = atom_getsymbol(a);
  iVar7 = iVar1;
  if (ptVar2 == &s__N) {
    ptVar2 = atom_getsymbol(a + 1);
    ptVar3 = gensym("canvas");
    if (ptVar2 == ptVar3) {
      iVar8 = 0;
      local_50 = 0;
      ptVar9 = a;
      iVar4 = iVar1;
      do {
        iVar6 = -1;
        ptVar5 = ptVar9;
        do {
          ptVar5 = ptVar5 + 1;
          if (iVar6 + iVar4 == -1) {
            iVar6 = iVar4;
            if (iVar4 == 0) goto LAB_00145532;
            goto LAB_00145696;
          }
          iVar6 = iVar6 + -1;
        } while (ptVar5->a_type != A_SEMI);
        iVar6 = -iVar6;
LAB_00145696:
        if (1 < iVar6) {
          ptVar2 = atom_getsymbol(ptVar9 + 1);
          ptVar3 = gensym("restore");
          if (ptVar2 == ptVar3) {
            ptVar2 = atom_getsymbol(ptVar9);
            local_50 = local_50 - (uint)(ptVar2 == &s__X);
          }
          ptVar2 = atom_getsymbol(ptVar9 + 1);
          ptVar3 = gensym("canvas");
          if (ptVar2 == ptVar3) {
            ptVar2 = atom_getsymbol(ptVar9);
            local_50 = local_50 + (uint)(ptVar2 == &s__N);
          }
        }
        if (iVar4 - iVar6 < 0) {
          return 0;
        }
        iVar8 = iVar8 + iVar6;
        a = ptVar9;
        ptVar9 = ptVar9 + iVar6;
        iVar7 = iVar4;
        iVar4 = iVar4 - iVar6;
      } while (0 < local_50);
      goto LAB_00145532;
    }
  }
  iVar8 = 0;
LAB_00145532:
  if (iVar7 < 4) {
    return 0;
  }
  ptVar2 = atom_getsymbol(a);
  if (ptVar2 != &s__X) {
    return 0;
  }
  ptVar2 = atom_getsymbol(a + 1);
  ptVar3 = gensym("restore");
  if ((((ptVar3 != ptVar2) && (ptVar3 = gensym("obj"), ptVar3 != ptVar2)) &&
      (ptVar3 = gensym("msg"), ptVar3 != ptVar2)) &&
     (((ptVar3 = gensym("text"), ptVar3 != ptVar2 &&
       (ptVar3 = gensym("floatatom"), ptVar3 != ptVar2)) &&
      ((ptVar3 = gensym("listbox"), ptVar3 != ptVar2 &&
       (ptVar3 = gensym("symbolatom"), ptVar3 != ptVar2)))))) {
    return 0;
  }
  if (x0 != (int *)0x0) {
    tVar10 = atom_getfloat(a + 2);
    *x0 = (int)tVar10;
  }
  if (y0 != (int *)0x0) {
    tVar10 = atom_getfloat(a + 3);
    *y0 = (int)tVar10;
  }
  if (type != (t_symbol **)0x0) {
    *type = ptVar2;
  }
  iVar4 = iVar8 + iVar7;
  do {
    iVar8 = iVar8 + 1;
    iVar6 = iVar8;
    if (a->a_type == A_SEMI) break;
    a = a + 1;
    iVar7 = iVar7 + -1;
    iVar6 = iVar4;
  } while (iVar7 != 0);
  return (iVar6 < iVar1) + 1;
}

Assistant:

static int binbuf_getpos(t_binbuf*b, int *x0, int *y0, t_symbol**type)
{
        /*
         * checks how many objects the binbuf contains and where they are located
         * for simplicity, we stop after the first object...
         * "objects" are any patchable things
         * returns: 0: no objects/...
         *          1: single object in binbuf
         *          2: more than one object in binbuf
         * (x0,y0) are the coordinates of the first object
         * (type) is the type of the first object ("obj", "msg",...)
         */
    t_atom*argv = binbuf_getvec(b);
    int argc = binbuf_getnatom(b);
    const int argc0 = argc;
    int count = 0;
    t_symbol*s;
        /* get the position of the first object in the argv binbuf */
    if(argc > 2
       && atom_getsymbol(argv+0) == &s__N
       && atom_getsymbol(argv+1) == gensym("canvas"))
    {
        int ac = argc;
        t_atom*ap = argv;
        int stack = 0;
        do {
            int off = binbuf_nextmess(argc, argv);
            if(!off)
                break;
            ac = argc;
            ap = argv;
            argc-=off;
            argv+=off;
            count+=off;
            if(off >= 2)
            {
                if (atom_getsymbol(ap+1) == gensym("restore")
                    && atom_getsymbol(ap) == &s__X)
                    {
                        stack--;
                    }
                if (atom_getsymbol(ap+1) == gensym("canvas")
                    && atom_getsymbol(ap) == &s__N)
                    {
                        stack++;
                    }
            }
            if(argc<0)
                return 0;
        } while (stack>0);
        argc = ac;
        argv = ap;
    }
    if(argc < 4 || atom_getsymbol(argv) != &s__X)
        return 0;
        /* #X obj|msg|text|floatatom|symbolatom <x> <y> ...
         * TODO: subpatches #N canvas + #X restore <x> <y>
         */
    s = atom_getsymbol(argv+1);
    if(gensym("restore") == s
       || gensym("obj") == s
       || gensym("msg") == s
       || gensym("text") == s
       || gensym("floatatom") == s
       || gensym("listbox") == s
       || gensym("symbolatom") == s)
    {
        if(x0)*x0=atom_getfloat(argv+2);
        if(y0)*y0=atom_getfloat(argv+3);
        if(type)*type=s;
    } else
        return 0;

        /* no wind the binbuf to the next message */
    while(argc--)
    {
        count++;
        if (A_SEMI == argv->a_type)
            break;
        argv++;
    }
    return 1+(argc0 > count);
}